

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O2

void png_chunk_report(png_const_structrp png_ptr,png_const_charp message,int error)

{
  char acStack_e8 [216];
  
  if ((png_ptr->mode & 0x8000) != 0) {
    if (1 < error) {
      png_chunk_benign_error(png_ptr,message);
      return;
    }
    if (png_ptr == (png_const_structrp)0x0) {
      png_warning((png_const_structrp)0x0,message);
      return;
    }
    png_format_buffer(png_ptr,acStack_e8,message);
    png_warning(png_ptr,acStack_e8);
    return;
  }
  if (0 < error) {
    png_app_error(png_ptr,message);
    return;
  }
  if ((png_ptr->flags & 0x200000) == 0) {
    png_error(png_ptr,message);
  }
  png_warning(png_ptr,message);
  return;
}

Assistant:

void /* PRIVATE */
png_chunk_report(png_const_structrp png_ptr, png_const_charp message, int error)
{
#  ifndef PNG_WARNINGS_SUPPORTED
      PNG_UNUSED(message)
#  endif

   /* This is always supported, but for just read or just write it
    * unconditionally does the right thing.
    */
#  if defined(PNG_READ_SUPPORTED) && defined(PNG_WRITE_SUPPORTED)
      if ((png_ptr->mode & PNG_IS_READ_STRUCT) != 0)
#  endif

#  ifdef PNG_READ_SUPPORTED
      {
         if (error < PNG_CHUNK_ERROR)
            png_chunk_warning(png_ptr, message);

         else
            png_chunk_benign_error(png_ptr, message);
      }
#  endif

#  if defined(PNG_READ_SUPPORTED) && defined(PNG_WRITE_SUPPORTED)
      else if ((png_ptr->mode & PNG_IS_READ_STRUCT) == 0)
#  endif

#  ifdef PNG_WRITE_SUPPORTED
      {
         if (error < PNG_CHUNK_WRITE_ERROR)
            png_app_warning(png_ptr, message);

         else
            png_app_error(png_ptr, message);
      }
#  endif
}